

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubByteTypes.cpp
# Opt level: O2

vector<MILBlob::UInt1,_std::allocator<MILBlob::UInt1>_> *
MILBlob::UnPackSubByteVecImpl<MILBlob::UInt1>
          (vector<MILBlob::UInt1,_std::allocator<MILBlob::UInt1>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vec,size_t numElements)

{
  pointer puVar1;
  type tVar2;
  invalid_argument *this;
  size_t i;
  pointer puVar3;
  size_t index;
  double dVar4;
  undefined1 auVar5 [16];
  Span<MILBlob::UInt1,_18446744073709551615UL> subByteSpan;
  
  std::vector<MILBlob::UInt1,_std::allocator<MILBlob::UInt1>_>::vector
            (__return_storage_ptr__,numElements,(allocator_type *)&subByteSpan);
  puVar3 = (vec->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (vec->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  auVar5._8_4_ = (int)(numElements >> 0x20);
  auVar5._0_8_ = numElements;
  auVar5._12_4_ = 0x45300000;
  dVar4 = ceil(((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)numElements) - 4503599627370496.0)) * 0.125);
  if ((long)puVar1 - (long)puVar3 ==
      ((long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4)) {
    if (numElements == 0) {
      puVar3 = (pointer)0x0;
    }
    subByteSpan.m_ptr = puVar3;
    subByteSpan.m_size.m_size = numElements;
    for (index = 0; numElements != index; index = index + 1) {
      tVar2 = Util::Span<MILBlob::UInt1,_18446744073709551615UL>::ValueAt(&subByteSpan,index);
      (__return_storage_ptr__->super__Vector_base<MILBlob::UInt1,_std::allocator<MILBlob::UInt1>_>).
      _M_impl.super__Vector_impl_data._M_start[index].data = tVar2.data;
    }
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this,
             "Unpacking to sub-byte type vector has invalid number of elements. Sub-byte vector with NumElements requires exactly vec.size() bytes."
            );
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::vector<T> UnPackSubByteVecImpl(const std::vector<uint8_t>& vec, size_t numElements)
{
    std::vector<T> ret(numElements);
    MILVerifyIsTrue(
        vec.size() == MILBlob::SizeInBytes<T>(numElements),
        std::invalid_argument,
        "Unpacking to sub-byte type vector has invalid number of elements. Sub-byte vector with NumElements "
        "requires exactly vec.size() bytes.");
    Util::Span<T> subByteSpan((typename MILBlob::Util::voidType<T>::type)(vec.data()), numElements);
    for (size_t i = 0; i < numElements; i++) {
        ret[i] = subByteSpan.ValueAt(i);
    }
    return ret;
}